

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_safe_forceExtDict
              (char *source,char *dest,int compressedSize,int maxOutputSize,void *dictStart,
              size_t dictSize)

{
  char *pcVar1;
  byte *pbVar2;
  char *pcVar3;
  char *pcVar4;
  byte bVar5;
  char cVar6;
  uint uVar7;
  undefined8 uVar8;
  ushort uVar9;
  ushort uVar10;
  long lVar11;
  long lVar12;
  size_t sVar13;
  char *pcVar14;
  char *pcVar15;
  ushort *puVar16;
  char *pcVar17;
  ulong uVar18;
  BYTE *d_1;
  char *pcVar19;
  ushort *puVar20;
  ushort *__src;
  int iVar21;
  BYTE *s;
  BYTE *d;
  char *pcVar22;
  ulong __n;
  BYTE *oCopyLimit;
  int local_50;
  
  iVar21 = -1;
  if (-1 < maxOutputSize && source != (char *)0x0) {
    lVar11 = (long)dictStart + dictSize;
    if (dictStart == (void *)0x0) {
      lVar11 = 0;
    }
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        iVar21 = -(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      pbVar2 = (byte *)(source + compressedSize);
      pcVar3 = dest + (uint)maxOutputSize;
      pcVar1 = pcVar3 + -7;
      puVar20 = (ushort *)source;
      pcVar22 = dest;
      do {
        while( true ) {
          __src = (ushort *)((long)puVar20 + 1);
          bVar5 = (byte)*puVar20;
          sVar13 = (size_t)(uint)(bVar5 >> 4);
          if (bVar5 >> 4 == 0xf) break;
          if ((source + (long)compressedSize + -0x10 <= __src) ||
             (dest + ((ulong)(uint)maxOutputSize - 0x20) < pcVar22)) goto LAB_00273a2a;
          uVar8 = *(undefined8 *)((long)puVar20 + 9);
          *(undefined8 *)pcVar22 = *(undefined8 *)__src;
          *(undefined8 *)(pcVar22 + 8) = uVar8;
          pcVar19 = pcVar22 + sVar13;
          uVar18 = (ulong)(bVar5 & 0xf);
          puVar20 = (ushort *)((long)__src + sVar13);
          __src = puVar20 + 1;
          uVar9 = *puVar20;
          pcVar14 = pcVar19 + -(ulong)uVar9;
          if (((uVar18 == 0xf) || (uVar9 < 8)) || (pcVar14 < dest)) goto LAB_00273ae3;
          *(undefined8 *)pcVar19 = *(undefined8 *)pcVar14;
          *(undefined8 *)(pcVar19 + 8) = *(undefined8 *)(pcVar14 + 8);
          *(undefined2 *)(pcVar19 + 0x10) = *(undefined2 *)(pcVar14 + 0x10);
          puVar20 = __src;
          pcVar22 = pcVar19 + uVar18 + 4;
        }
        if (pbVar2 + -0xf <= __src) goto LAB_00273d24;
        puVar20 = puVar20 + 1;
        lVar12 = 0;
        puVar16 = __src;
        do {
          __src = (ushort *)((long)puVar16 + 1);
          if (pbVar2 + -0xf < __src) goto LAB_00273d24;
          uVar9 = *puVar16;
          lVar12 = lVar12 + (ulong)(byte)uVar9;
          puVar20 = (ushort *)((long)puVar20 + 1);
          puVar16 = __src;
        } while ((ulong)(byte)uVar9 == 0xff);
        if (((lVar12 == -1) || (sVar13 = lVar12 + 0xf, CARRY8((ulong)pcVar22,sVar13))) ||
           ((ulong)-(long)puVar20 < sVar13)) goto LAB_00273d24;
LAB_00273a2a:
        pcVar19 = pcVar22 + sVar13;
        if ((pcVar3 + -0xc < pcVar19) ||
           (puVar20 = (ushort *)((long)__src + sVar13), pbVar2 + -8 < puVar20)) {
          if (((byte *)((long)__src + sVar13) == pbVar2) && (pcVar19 <= pcVar3)) {
            memmove(pcVar22,__src,sVar13);
            return (int)pcVar19 - (int)dest;
          }
LAB_00273d24:
          local_50 = (int)source;
          return ~(uint)__src + local_50;
        }
        do {
          *(undefined8 *)pcVar22 = *(undefined8 *)__src;
          pcVar22 = pcVar22 + 8;
          __src = __src + 4;
        } while (pcVar22 < pcVar19);
        uVar9 = *puVar20;
        __src = puVar20 + 1;
        pcVar14 = pcVar19 + -(ulong)uVar9;
        uVar18 = (ulong)(bVar5 & 0xf);
LAB_00273ae3:
        if ((int)uVar18 == 0xf) {
          lVar12 = 0;
          puVar20 = __src;
          do {
            __src = (ushort *)((long)puVar20 + 1);
            if (pbVar2 + -4 < __src) goto LAB_00273d24;
            uVar10 = *puVar20;
            lVar12 = lVar12 + (ulong)(byte)uVar10;
            puVar20 = __src;
          } while ((ulong)(byte)uVar10 == 0xff);
          uVar18 = lVar12 + 0xf;
          if ((lVar12 == -1) || (CARRY8((ulong)pcVar19,uVar18))) goto LAB_00273d24;
        }
        if ((dictSize < 0x10000) && (pcVar14 + dictSize < dest)) goto LAB_00273d24;
        sVar13 = uVar18 + 4;
        pcVar4 = pcVar19 + sVar13;
        puVar20 = __src;
        pcVar22 = pcVar4;
        if (pcVar14 < dest) {
          if (pcVar3 + -5 < pcVar4) goto LAB_00273d24;
          __n = (long)dest - (long)pcVar14;
          uVar18 = sVar13 - __n;
          if (sVar13 < __n || uVar18 == 0) {
            memmove(pcVar19,(void *)(lVar11 - __n),sVar13);
          }
          else {
            memcpy(pcVar19,(void *)(lVar11 - __n),__n);
            pcVar22 = pcVar19 + __n;
            pcVar19 = dest;
            if ((ulong)((long)pcVar22 - (long)dest) < uVar18) {
              for (; pcVar22 < pcVar4; pcVar22 = pcVar22 + 1) {
                *pcVar22 = *pcVar19;
                pcVar19 = pcVar19 + 1;
              }
            }
            else {
              memcpy(pcVar22,dest,uVar18);
              pcVar22 = pcVar4;
            }
          }
        }
        else {
          if (uVar9 < 8) {
            pcVar19[0] = '\0';
            pcVar19[1] = '\0';
            pcVar19[2] = '\0';
            pcVar19[3] = '\0';
            *pcVar19 = *pcVar14;
            pcVar19[1] = pcVar14[1];
            pcVar19[2] = pcVar14[2];
            pcVar19[3] = pcVar14[3];
            uVar7 = inc32table[uVar9];
            *(undefined4 *)(pcVar19 + 4) = *(undefined4 *)(pcVar14 + uVar7);
            pcVar14 = pcVar14 + ((ulong)uVar7 - (long)dec64table[uVar9]);
          }
          else {
            *(undefined8 *)pcVar19 = *(undefined8 *)pcVar14;
            pcVar14 = pcVar14 + 8;
          }
          pcVar15 = pcVar19 + 8;
          if (pcVar3 + -0xc < pcVar4) {
            if (pcVar3 + -5 < pcVar4) goto LAB_00273d24;
            pcVar19 = pcVar14;
            pcVar17 = pcVar15;
            if (pcVar15 < pcVar1) {
              do {
                *(undefined8 *)pcVar17 = *(undefined8 *)pcVar19;
                pcVar17 = pcVar17 + 8;
                pcVar19 = pcVar19 + 8;
              } while (pcVar17 < pcVar1);
              pcVar14 = pcVar14 + ((long)pcVar1 - (long)pcVar15);
              pcVar15 = pcVar1;
            }
            for (; pcVar15 < pcVar4; pcVar15 = pcVar15 + 1) {
              cVar6 = *pcVar14;
              pcVar14 = pcVar14 + 1;
              *pcVar15 = cVar6;
            }
          }
          else {
            *(undefined8 *)pcVar15 = *(undefined8 *)pcVar14;
            if (0x10 < sVar13) {
              pcVar19 = pcVar19 + 0x10;
              do {
                pcVar14 = pcVar14 + 8;
                *(undefined8 *)pcVar19 = *(undefined8 *)pcVar14;
                pcVar19 = pcVar19 + 8;
              } while (pcVar19 < pcVar4);
            }
          }
        }
      } while( true );
    }
  }
  return iVar21;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe_forceExtDict(const char* source, char* dest,
                                     int compressedSize, int maxOutputSize,
                                     const void* dictStart, size_t dictSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                  decode_full_block, usingExtDict,
                                  (BYTE*)dest, (const BYTE*)dictStart, dictSize);
}